

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

int SUNMatMatvec_Sparse(SUNMatrix A,N_Vector x,N_Vector y)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  sunindextype sVar9;
  sunindextype sVar10;
  realtype *prVar11;
  realtype *prVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  
  uVar16 = 0xfffffd43;
  if ((x->ops->nvgetarraypointer != (_func_realtype_ptr_N_Vector *)0x0) &&
     (y->ops->nvgetarraypointer != (_func_realtype_ptr_N_Vector *)0x0)) {
    sVar9 = SUNSparseMatrix_Columns(A);
    sVar10 = N_VGetLength(x);
    if (sVar9 == sVar10) {
      sVar9 = SUNSparseMatrix_Rows(A);
      sVar10 = N_VGetLength(y);
      if (sVar9 == sVar10) {
        pvVar4 = A->content;
        lVar5 = *(long *)((long)pvVar4 + 0x28);
        lVar6 = *(long *)((long)pvVar4 + 0x10);
        lVar7 = *(long *)((long)pvVar4 + 0x20);
        if (*(int *)((long)pvVar4 + 0x18) == 0) {
          uVar16 = 0xfffffd42;
          if (lVar6 != 0 && (lVar7 != 0 && lVar5 != 0)) {
            prVar11 = N_VGetArrayPointer(x);
            prVar12 = N_VGetArrayPointer(y);
            if (prVar11 != prVar12 && (prVar12 != (realtype *)0x0 && prVar11 != (realtype *)0x0)) {
              puVar8 = (uint *)A->content;
              uVar16 = *puVar8;
              uVar13 = 0;
              uVar15 = (ulong)uVar16;
              if ((int)uVar16 < 1) {
                uVar15 = uVar13;
              }
              for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
                prVar12[uVar13] = 0.0;
              }
              uVar2 = puVar8[1];
              uVar16 = 0;
              if ((int)uVar2 < 1) {
                uVar2 = uVar16;
              }
              uVar15 = 0;
              while (uVar13 = uVar15, uVar13 != uVar2) {
                iVar1 = *(int *)(lVar5 + 4 + uVar13 * 4);
                for (lVar17 = (long)*(int *)(lVar5 + uVar13 * 4); uVar15 = uVar13 + 1,
                    lVar17 < iVar1; lVar17 = lVar17 + 1) {
                  iVar3 = *(int *)(lVar7 + lVar17 * 4);
                  prVar12[iVar3] =
                       *(double *)(lVar6 + lVar17 * 8) * prVar11[uVar13] + prVar12[iVar3];
                }
              }
            }
          }
        }
        else {
          uVar16 = 0xfffffd42;
          if (lVar6 != 0 && (lVar7 != 0 && lVar5 != 0)) {
            prVar11 = N_VGetArrayPointer(x);
            prVar12 = N_VGetArrayPointer(y);
            if (prVar11 != prVar12 && (prVar12 != (realtype *)0x0 && prVar11 != (realtype *)0x0)) {
              uVar13 = 0;
              uVar15 = (ulong)*A->content;
              if ((int)*A->content < 1) {
                uVar15 = uVar13;
              }
              for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
                prVar12[uVar13] = 0.0;
              }
              uVar16 = 0;
              uVar13 = 0;
              while (uVar14 = uVar13, uVar14 != uVar15) {
                iVar1 = *(int *)(lVar5 + 4 + uVar14 * 4);
                for (lVar17 = (long)*(int *)(lVar5 + uVar14 * 4); uVar13 = uVar14 + 1,
                    lVar17 < iVar1; lVar17 = lVar17 + 1) {
                  prVar12[uVar14] =
                       *(double *)(lVar6 + lVar17 * 8) * prVar11[*(int *)(lVar7 + lVar17 * 4)] +
                       prVar12[uVar14];
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar16;
}

Assistant:

static booleantype SMCompatible2_Sparse(SUNMatrix A, N_Vector x, N_Vector y)
{
  /* vectors must implement N_VGetArrayPointer */
  if ( (x->ops->nvgetarraypointer == NULL) ||
       (y->ops->nvgetarraypointer == NULL) )
    return SUNFALSE;

  /* Verify that the dimensions of A, x, and y agree */
  if ( (SUNSparseMatrix_Columns(A) != N_VGetLength(x)) ||
       (SUNSparseMatrix_Rows(A) != N_VGetLength(y)) )
    return SUNFALSE;

  return SUNTRUE;
}